

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsClutch.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsClutch::ArchiveIN(ChShaftsClutch *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsClutch>(marchive);
  ChShaftsCouple::ArchiveIN(&this->super_ChShaftsCouple,marchive);
  local_30._value = &this->maxT;
  local_30._name = "maxT";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->minT;
  local_48._name = "minT";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->modulation;
  local_60._name = "modulation";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChShaftsClutch::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsClutch>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(maxT);
    marchive >> CHNVP(minT);
    marchive >> CHNVP(modulation);
}